

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

int enter_frame(flatcc_builder_t *B,uint16_t align)

{
  int iVar1;
  flatbuffers_uoffset_t fVar2;
  flatbuffers_uoffset_t fVar3;
  int iVar4;
  __flatcc_builder_frame_t *p_Var5;
  int iVar6;
  ulong uVar7;
  
  iVar1 = B->level;
  B->level = iVar1 + 1;
  if (iVar1 < B->limit_level) {
    B->frame = B->frame + 1;
  }
  else {
    if (0 < B->max_level && B->max_level <= iVar1) {
      return -1;
    }
    uVar7 = (long)iVar1 * 0x24 + 0x24;
    if ((B->buffers[4].iov_len < uVar7) &&
       (iVar4 = (*B->alloc)(B->alloc_context,B->buffers + 4,uVar7,0,4), iVar4 != 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x13c,"void *reserve_buffer(flatcc_builder_t *, int, size_t, size_t, int)");
    }
    p_Var5 = (__flatcc_builder_frame_t *)((long)iVar1 * 0x24 + (long)B->buffers[4].iov_base);
    B->frame = p_Var5;
    if (p_Var5 == (__flatcc_builder_frame_t *)0x0) {
      return -1;
    }
    iVar1 = B->max_level;
    iVar6 = (int)(B->buffers[4].iov_len / 0x24);
    iVar4 = iVar6;
    if (iVar1 < iVar6) {
      iVar4 = iVar1;
    }
    if (iVar1 < 1) {
      iVar4 = iVar6;
    }
    B->limit_level = iVar4;
  }
  fVar2 = B->ds_offset;
  p_Var5 = B->frame;
  p_Var5->ds_offset = fVar2;
  p_Var5->align = B->align;
  B->align = align;
  fVar3 = B->ds_first;
  p_Var5->ds_first = fVar3;
  p_Var5->type_limit = 0xfffffffc;
  B->ds_first = fVar2 + fVar3 + 7 & 0xfffffff8;
  B->ds_offset = 0;
  return 0;
}

Assistant:

static int enter_frame(flatcc_builder_t *B, uint16_t align)
{
    if (++B->level > B->limit_level) {
        if (B->max_level > 0 && B->level > B->max_level) {
            return -1;
        }
        if (!(B->frame = reserve_buffer(B, flatcc_builder_alloc_fs,
                        (size_t)(B->level - 1) * frame_size, frame_size, 0))) {
            return -1;
        }
        B->limit_level = (int)(B->buffers[flatcc_builder_alloc_fs].iov_len / frame_size);
        if (B->max_level > 0 && B->max_level < B->limit_level) {
            B->limit_level = B->max_level;
        }
    } else {
        ++B->frame;
    }
    frame(ds_offset) = B->ds_offset;
    frame(align) = B->align;
    B->align = align;
    /* Note: do not assume padding before first has been allocated! */
    frame(ds_first) = B->ds_first;
    frame(type_limit) = data_limit;
    B->ds_first = alignup_uoffset(B->ds_first + B->ds_offset, 8);
    B->ds_offset = 0;
    return 0;
}